

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  ostream *poVar6;
  string *psVar7;
  ulong uVar8;
  FILE *__stream;
  size_t sVar9;
  pointer pPVar10;
  exception *e;
  size_t len;
  undefined1 local_8b8 [7];
  bool done;
  uchar buf [2048];
  unique_ptr<Pl_StdioFile,_std::default_delete<Pl_StdioFile>_> local_b0;
  __single_object out;
  FileCloser fc;
  FILE *f;
  string difference;
  char *password;
  char *expected;
  char *actual;
  char *to_output;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  char **ppcStack_18;
  bool show_why;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  pcVar4 = strrchr(*argv,0x2f);
  if (pcVar4 == (char *)0x0) {
    whoami = *ppcStack_18;
  }
  else {
    whoami = pcVar4 + 1;
  }
  if (((int)argv_local == 2) && (iVar3 = strcmp(ppcStack_18[1],"--version"), iVar3 == 0)) {
    poVar5 = std::operator<<((ostream *)&std::cout,whoami);
    poVar6 = std::operator<<(poVar5," from qpdf version ");
    psVar7 = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)poVar5);
    poVar5 = std::operator<<(poVar6,psVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  if (((int)argv_local < 3) || (4 < (int)argv_local)) {
    usage();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"QPDF_COMPARE_WHY",&local_41);
  bVar2 = QUtil::get_env(local_40,(string *)0x0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = bVar2 & 1;
  pcVar4 = ppcStack_18[1];
  actual = ppcStack_18[2];
  difference.field_2._8_8_ = 0;
  if ((int)argv_local == 4) {
    difference.field_2._8_8_ = ppcStack_18[3];
  }
  compare_abi_cxx11_((string *)&f,pcVar4,actual,(char *)difference.field_2._8_8_);
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) == 0) && (actual = pcVar4, (local_19 & 1) != 0)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&f);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  __stream = (FILE *)QUtil::safe_fopen(actual,"rb");
  QUtil::FileCloser::FileCloser((FileCloser *)&out,(FILE *)__stream);
  QUtil::binary_stdout();
  std::make_unique<Pl_StdioFile,char_const(&)[7],_IO_FILE*&>
            ((char (*) [7])&local_b0,(_IO_FILE **)"stdout");
  bVar1 = false;
  while (!bVar1) {
    sVar9 = fread(local_8b8,1,0x800,__stream);
    if (sVar9 == 0) {
      bVar1 = true;
    }
    else {
      pPVar10 = std::unique_ptr<Pl_StdioFile,_std::default_delete<Pl_StdioFile>_>::operator->
                          (&local_b0);
      (**(code **)(*(long *)pPVar10 + 0x10))(pPVar10,local_8b8,sVar9);
    }
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    std::unique_ptr<Pl_StdioFile,_std::default_delete<Pl_StdioFile>_>::~unique_ptr(&local_b0);
    QUtil::FileCloser::~FileCloser((FileCloser *)&out);
    std::__cxx11::string::~string((string *)&f);
    return 0;
  }
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " from qpdf version " << QPDF::QPDFVersion() << std::endl;
        exit(0);
    }

    if (argc < 3 || argc > 4) {
        usage();
    }

    bool show_why = QUtil::get_env("QPDF_COMPARE_WHY");
    try {
        char const* to_output;
        char const* actual = argv[1];
        char const* expected = argv[2];
        char const* password{nullptr};
        if (argc == 4) {
            password = argv[3];
        }
        auto difference = compare(actual, expected, password);
        if (difference.empty()) {
            // The files are identical; write the expected file. This way, tests can be written
            // that compare the output of this program to the expected file.
            to_output = expected;
        } else {
            if (show_why) {
                std::cerr << difference << std::endl;
                exit(2);
            }
            // The files differ; write the actual file. If it is determined that the actual file
            // is correct because of changes that result in intended differences, this enables
            // the output of this program to replace the expected file in the test suite.
            to_output = actual;
        }
        auto f = QUtil::safe_fopen(to_output, "rb");
        QUtil::FileCloser fc(f);
        QUtil::binary_stdout();
        auto out = std::make_unique<Pl_StdioFile>("stdout", stdout);
        unsigned char buf[2048];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                out->write(buf, len);
            }
        }
        if (!difference.empty()) {
            exit(2);
        }
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}